

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetActiveID(ImGuiID id,ImGuiWindow *window)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  ImGuiInputSource IVar3;
  char *pcVar4;
  char *pcVar5;
  
  pIVar2 = GImGui;
  if ((GImGui->MovingWindow != (ImGuiWindow *)0x0) &&
     (GImGui->ActiveId == GImGui->MovingWindow->MoveId)) {
    if ((GImGui->DebugLogFlags & 1) != 0) {
      DebugLog("SetActiveID() cancel MovingWindow\n");
    }
    pIVar2->MovingWindow = (ImGuiWindow *)0x0;
  }
  uVar1 = pIVar2->ActiveId;
  pIVar2->ActiveIdIsJustActivated = uVar1 != id;
  if (uVar1 == id) {
    pIVar2->ActiveIdAllowOverlap = false;
    pIVar2->ActiveIdNoClearOnFocusLoss = false;
    pIVar2->ActiveIdWindow = window;
    pIVar2->ActiveIdHasBeenEditedThisFrame = false;
    if (id == 0) goto LAB_001e1971;
  }
  else {
    if ((pIVar2->DebugLogFlags & 1) != 0) {
      pcVar5 = "";
      pcVar4 = "";
      if (pIVar2->ActiveIdWindow != (ImGuiWindow *)0x0) {
        pcVar4 = pIVar2->ActiveIdWindow->Name;
      }
      if (window != (ImGuiWindow *)0x0) {
        pcVar5 = window->Name;
      }
      DebugLog("SetActiveID() old:0x%08X (window \"%s\") -> new:0x%08X (window \"%s\")\n",
               (ulong)uVar1,pcVar4,id,pcVar5);
    }
    pIVar2->ActiveIdTimer = 0.0;
    pIVar2->ActiveIdHasBeenPressedBefore = false;
    pIVar2->ActiveIdHasBeenEditedBefore = false;
    pIVar2->ActiveIdMouseButton = -1;
    if (id == 0) {
      pIVar2->ActiveId = 0;
      pIVar2->ActiveIdAllowOverlap = false;
      pIVar2->ActiveIdNoClearOnFocusLoss = false;
      pIVar2->ActiveIdWindow = window;
      pIVar2->ActiveIdHasBeenEditedThisFrame = false;
      goto LAB_001e1971;
    }
    pIVar2->LastActiveId = id;
    pIVar2->LastActiveIdTimer = 0.0;
    pIVar2->ActiveId = id;
    pIVar2->ActiveIdAllowOverlap = false;
    pIVar2->ActiveIdNoClearOnFocusLoss = false;
    pIVar2->ActiveIdWindow = window;
    pIVar2->ActiveIdHasBeenEditedThisFrame = false;
  }
  pIVar2->ActiveIdIsAlive = id;
  IVar3 = ImGuiInputSource_Nav;
  if ((pIVar2->NavActivateId != id) && (pIVar2->NavActivateInputId != id)) {
    IVar3 = (uint)(pIVar2->NavJustMovedToId == id) * 4 + ImGuiInputSource_Mouse;
  }
  pIVar2->ActiveIdSource = IVar3;
LAB_001e1971:
  pIVar2->ActiveIdUsingNavDirMask = 0;
  pIVar2->ActiveIdUsingAllKeyboardKeys = false;
  pIVar2->ActiveIdUsingNavInputMask = 0;
  return;
}

Assistant:

void ImGui::SetActiveID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    // While most behaved code would make an effort to not steal active id during window move/drag operations,
    // we at least need to be resilient to it. Cancelling the move is rather aggressive and users of 'master' branch
    // may prefer the weird ill-defined half working situation ('docking' did assert), so may need to rework that.
    if (g.MovingWindow != NULL && g.ActiveId == g.MovingWindow->MoveId)
    {
        IMGUI_DEBUG_LOG_ACTIVEID("SetActiveID() cancel MovingWindow\n");
        g.MovingWindow = NULL;
    }

    // Set active id
    g.ActiveIdIsJustActivated = (g.ActiveId != id);
    if (g.ActiveIdIsJustActivated)
    {
        IMGUI_DEBUG_LOG_ACTIVEID("SetActiveID() old:0x%08X (window \"%s\") -> new:0x%08X (window \"%s\")\n", g.ActiveId, g.ActiveIdWindow ? g.ActiveIdWindow->Name : "", id, window ? window->Name : "");
        g.ActiveIdTimer = 0.0f;
        g.ActiveIdHasBeenPressedBefore = false;
        g.ActiveIdHasBeenEditedBefore = false;
        g.ActiveIdMouseButton = -1;
        if (id != 0)
        {
            g.LastActiveId = id;
            g.LastActiveIdTimer = 0.0f;
        }
    }
    g.ActiveId = id;
    g.ActiveIdAllowOverlap = false;
    g.ActiveIdNoClearOnFocusLoss = false;
    g.ActiveIdWindow = window;
    g.ActiveIdHasBeenEditedThisFrame = false;
    if (id)
    {
        g.ActiveIdIsAlive = id;
        g.ActiveIdSource = (g.NavActivateId == id || g.NavActivateInputId == id || g.NavJustMovedToId == id) ? (ImGuiInputSource)ImGuiInputSource_Nav : ImGuiInputSource_Mouse;
    }

    // Clear declaration of inputs claimed by the widget
    // (Please note that this is WIP and not all keys/inputs are thoroughly declared by all widgets yet)
    g.ActiveIdUsingNavDirMask = 0x00;
    g.ActiveIdUsingAllKeyboardKeys = false;
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    g.ActiveIdUsingNavInputMask = 0x00;
#endif
}